

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O3

void ucnv_fixFileSeparator_63(UConverter *cnv,UChar *source,int32_t sourceLength)

{
  UChar UVar1;
  UAmbiguousConverter *pUVar2;
  ulong uVar3;
  
  if ((0 < sourceLength && (source != (UChar *)0x0 && cnv != (UConverter *)0x0)) &&
     (pUVar2 = ucnv_getAmbiguous(cnv), pUVar2 != (UAmbiguousConverter *)0x0)) {
    UVar1 = pUVar2->variant5c;
    uVar3 = 0;
    do {
      if (source[uVar3] == UVar1) {
        source[uVar3] = L'\\';
      }
      uVar3 = uVar3 + 1;
    } while ((uint)sourceLength != uVar3);
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_fixFileSeparator(const UConverter *cnv, 
                      UChar* source, 
                      int32_t sourceLength) {
    const UAmbiguousConverter *a;
    int32_t i;
    UChar variant5c;

    if(cnv==NULL || source==NULL || sourceLength<=0 || (a=ucnv_getAmbiguous(cnv))==NULL)
    {
        return;
    }

    variant5c=a->variant5c;
    for(i=0; i<sourceLength; ++i) {
        if(source[i]==variant5c) {
            source[i]=0x5c;
        }
    }
}